

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

void xmlCtxtDumpNamespace(xmlDebugCtxtPtr ctxt,xmlNsPtr ns)

{
  char *msg;
  int error;
  
  xmlCtxtDumpSpaces(ctxt);
  if (ns->type == XML_NAMESPACE_DECL) {
    if (ns->href != (xmlChar *)0x0) {
      if (ctxt->check != 0) {
        return;
      }
      if (ns->prefix == (xmlChar *)0x0) {
        fwrite("default namespace href=",0x17,1,(FILE *)ctxt->output);
      }
      else {
        fprintf((FILE *)ctxt->output,"namespace %s href=");
      }
      xmlCtxtDumpString(ctxt,ns->href);
      fputc(10,(FILE *)ctxt->output);
      return;
    }
    if (ns->prefix != (xmlChar *)0x0) {
      xmlDebugErr3(ctxt,0x13a4,"Incomplete namespace %s href=NULL\n",(char *)ns->prefix);
      return;
    }
    msg = "Incomplete default namespace href=NULL\n";
    error = 0x13a4;
  }
  else {
    msg = "Node is not a namespace declaration";
    error = 0x13a3;
  }
  xmlDebugErr(ctxt,error,msg);
  return;
}

Assistant:

static void
xmlCtxtDumpNamespace(xmlDebugCtxtPtr ctxt, xmlNsPtr ns)
{
    xmlCtxtDumpSpaces(ctxt);

    if (ns == NULL) {
        if (!ctxt->check)
            fprintf(ctxt->output, "namespace node is NULL\n");
        return;
    }
    if (ns->type != XML_NAMESPACE_DECL) {
	xmlDebugErr(ctxt, XML_CHECK_NOT_NS_DECL,
	            "Node is not a namespace declaration");
        return;
    }
    if (ns->href == NULL) {
        if (ns->prefix != NULL)
	    xmlDebugErr3(ctxt, XML_CHECK_NO_HREF,
                    "Incomplete namespace %s href=NULL\n",
                    (char *) ns->prefix);
        else
	    xmlDebugErr(ctxt, XML_CHECK_NO_HREF,
                    "Incomplete default namespace href=NULL\n");
    } else {
        if (!ctxt->check) {
            if (ns->prefix != NULL)
                fprintf(ctxt->output, "namespace %s href=",
                        (char *) ns->prefix);
            else
                fprintf(ctxt->output, "default namespace href=");

            xmlCtxtDumpString(ctxt, ns->href);
            fprintf(ctxt->output, "\n");
        }
    }
}